

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

void __thiscall
google::protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AddAnnotation
          (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this,size_t begin_offset,
          size_t end_offset,string *file_path,vector<int,_std::allocator<int>_> *path,
          optional<google::protobuf::io::AnnotationCollector::Semantic> semantic)

{
  int *piVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>_>
  *this_00;
  Arena *arena;
  int *piVar2;
  
  this_00 = internal::RepeatedPtrFieldBase::
            Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>>
                      ((RepeatedPtrFieldBase *)&(this->annotation_proto_->field_0)._impl_);
  piVar1 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar2 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    RepeatedField<int>::Add(&(this_00->field_0)._impl_.path_,*piVar2);
  }
  *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 | 1;
  arena = (Arena *)(this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&(this_00->field_0)._impl_.source_file_,file_path,arena);
  (this_00->field_0)._impl_.begin_ = (int32_t)begin_offset;
  (this_00->field_0)._impl_.end_ = (int32_t)end_offset;
  *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 | 6;
  if (((ulong)semantic.
              super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>.
              _M_payload.
              super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> >>
       0x20 & 1) == 0) {
    return;
  }
  GeneratedCodeInfo_Annotation::set_semantic
            (this_00,semantic.
                     super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>
                     ._M_payload);
  return;
}

Assistant:

void AddAnnotation(size_t begin_offset, size_t end_offset,
                     const std::string& file_path, const std::vector<int>& path,
                     absl::optional<Semantic> semantic) override {
    auto* annotation = annotation_proto_->add_annotation();
    for (const int segment : path) {
      annotation->add_path(segment);
    }
    annotation->set_source_file(file_path);
    annotation->set_begin(begin_offset);
    annotation->set_end(end_offset);

    if (semantic.has_value()) {
      SetSemantic(annotation, *semantic, Rank1{});
    }
  }